

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O0

void amrex::Abort_host(char *msg)

{
  runtime_error *this;
  char *in_RDI;
  char *in_stack_000001b0;
  char *in_stack_ffffffffffffffe0;
  
  if (system::error_handler == (code *)0x0) {
    if (system::throw_exception != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,in_RDI);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    anon_unknown.dwarf_8d3aaa::write_lib_id(in_stack_ffffffffffffffe0);
    write_to_stderr_without_buffering(in_stack_000001b0);
    ParallelDescriptor::Abort(0,false);
  }
  else {
    (*system::error_handler)(in_RDI);
  }
  return;
}

Assistant:

void
amrex::Abort_host (const char * msg)
{
    if (system::error_handler) {
        system::error_handler(msg);
    } else if (system::throw_exception) {
        throw RuntimeError(msg);
    } else {
       write_lib_id("Abort");
       write_to_stderr_without_buffering(msg);
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_abort_omp_critical)
#endif
       ParallelDescriptor::Abort();
   }
}